

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int serial_open(int pi,char *dev,uint baud,uint flags)

{
  int iVar1;
  size_t sVar2;
  gpioExtent_t ext [1];
  
  sVar2 = strlen(dev);
  ext[0].size = (size_t)(int)sVar2;
  ext[0].ptr = dev;
  iVar1 = pigpio_command_ext(pi,0x4c,baud,flags,(int)sVar2,1,ext,1);
  return iVar1;
}

Assistant:

int serial_open(int pi, char *dev, unsigned baud, unsigned flags)
{
   int len;
   gpioExtent_t ext[1];

   len = strlen(dev);

   /*
   p1=baud
   p2=flags
   p3=len
   ## extension ##
   char dev[len]
   */

   ext[0].size = len;
   ext[0].ptr = dev;

   return pigpio_command_ext
      (pi, PI_CMD_SERO, baud, flags, len, 1, ext, 1);
}